

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void do_gc(void)

{
  int64_t iVar1;
  object *poVar2;
  int64_t iVar3;
  long lVar4;
  object ***pppoVar5;
  object **ppoVar6;
  bool bVar7;
  
  lVar4 = 0;
  iVar1 = time_usec();
  bVar7 = inSpaceOne == 0;
  memoryBase = spaceTwo;
  if (bVar7) {
    memoryBase = spaceOne;
  }
  inSpaceOne = (int)bVar7;
  oldBase = spaceOne;
  if (bVar7) {
    oldBase = spaceTwo;
  }
  memoryPointer = memoryBase + spaceSize;
  oldTop = oldBase + spaceSize;
  ppoVar6 = rootStack;
  memoryTop = memoryPointer;
  for (; lVar4 < rootTop; lVar4 = lVar4 + 1) {
    poVar2 = gc_move((mobject *)*ppoVar6);
    *ppoVar6 = poVar2;
    ppoVar6 = ppoVar6 + 1;
  }
  pppoVar5 = staticRoots;
  for (lVar4 = 0; lVar4 < staticRootTop; lVar4 = lVar4 + 1) {
    poVar2 = gc_move((mobject *)**pppoVar5);
    **pppoVar5 = poVar2;
    pppoVar5 = pppoVar5 + 1;
  }
  flushCache();
  lVar4 = (long)memoryTop - (long)memoryPointer;
  gc_total_mem_copied = gc_total_mem_copied + lVar4;
  if (gc_mem_max_copied < lVar4) {
    gc_mem_max_copied = lVar4;
  }
  iVar3 = time_usec();
  gc_count = gc_count + 1;
  lVar4 = iVar3 - iVar1;
  gc_total_time = gc_total_time + lVar4;
  if (gc_max_time < lVar4) {
    gc_max_time = lVar4;
  }
  return;
}

Assistant:

void do_gc()
{
    int i;
    int64_t start = time_usec();
    int64_t end = 0;

    /* first change spaces */
    if (inSpaceOne) {
        memoryBase = spaceTwo;
        inSpaceOne = 0;
        oldBase = spaceOne;
    } else {
        memoryBase = spaceOne;
        inSpaceOne = 1;
        oldBase = spaceTwo;
    }

    memoryPointer = memoryTop = memoryBase + spaceSize;
    oldTop = oldBase + spaceSize;

    /* then do the collection */
    for (i = 0; i < rootTop; i++) {
        rootStack[i] = gc_move((struct mobject *) rootStack[i]);
    }
    for (i = 0; i < staticRootTop; i++) {
        (* staticRoots[i]) =  gc_move((struct mobject *)
                                      *staticRoots[i]);
    }

    flushCache();

    /* FIXME - pointer comparisons are NOT portable. */
    gc_total_mem_copied += ((char *)memoryTop - (char *)memoryPointer);
    if(((char *)memoryTop - (char *)memoryPointer) > gc_mem_max_copied) {
        gc_mem_max_copied = ((char *)memoryTop - (char *)memoryPointer);
    }

    end = time_usec();

    /* calculate stats about the GC runs. */
    gc_count++;
    gc_total_time += (end - start);

    if(gc_max_time < (end - start)) {
        gc_max_time = (end - start);
    }
}